

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O2

ssh_key * opensshcert_new_priv_openssh(ssh_keyalg *self,BinarySource *src)

{
  blob_fmt *pbVar1;
  _Bool _Var2;
  opensshcert_key *poVar3;
  strbuf *buf_o;
  ssh_key *psVar4;
  ptrlen blob;
  BlobTransformer bt [1];
  strbuf *basepub;
  BinarySource osshsrc [1];
  BinarySource pubsrc [1];
  BlobTransformer local_a8;
  strbuf *local_90;
  BinarySource local_88;
  BinarySource local_58;
  
  pbVar1 = (blob_fmt *)self->extra;
  blob = BinarySource_get_string(src->binarysource_);
  poVar3 = opensshcert_new_shared(self,blob,&local_90);
  if (poVar3 != (opensshcert_key *)0x0) {
    buf_o = strbuf_new();
    local_a8.parts = (ptrlen *)0x0;
    local_a8.nparts = 0;
    local_58.data = local_90->u;
    local_58.len = local_90->len;
    local_58.pos = 0;
    local_58.err = BSE_NO_ERROR;
    local_58.binarysource_ = &local_58;
    BinarySource_get_string(&local_58);
    _Var2 = blobtrans_read(&local_a8,&local_58,*pbVar1);
    if (_Var2) {
      _Var2 = blobtrans_read(&local_a8,src,pbVar1[2]);
      blobtrans_write(&local_a8,buf_o->binarysink_,pbVar1[1]);
      blobtrans_clear(&local_a8);
      if (_Var2) {
        strbuf_free(local_90);
        local_88.data = buf_o->u;
        local_88.len = buf_o->len;
        local_88.binarysource_ = &local_88;
        local_88.pos = 0;
        local_88.err = BSE_NO_ERROR;
        psVar4 = (*self->base_alg->new_priv_openssh)(self->base_alg,local_88.binarysource_);
        poVar3->basekey = psVar4;
        strbuf_free(buf_o);
        psVar4 = &poVar3->sshk;
        if (poVar3->basekey == (ssh_key *)0x0) {
          (*psVar4->vt->freekey)(psVar4);
          return (ssh_key *)0x0;
        }
        return psVar4;
      }
    }
    else {
      blobtrans_write(&local_a8,buf_o->binarysink_,pbVar1[1]);
      blobtrans_clear(&local_a8);
    }
    (*((poVar3->sshk).vt)->freekey)(&poVar3->sshk);
    strbuf_free(local_90);
    strbuf_free(buf_o);
  }
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *opensshcert_new_priv_openssh(
    const ssh_keyalg *self, BinarySource *src)
{
    const opensshcert_extra *extra = self->extra;

    ptrlen cert = get_string(src);

    strbuf *basepub;
    opensshcert_key *ck = opensshcert_new_shared(self, cert, &basepub);
    if (!ck)
        return NULL;

    strbuf *baseossh = strbuf_new();

    /* Make the base OpenSSH key blob out of the public key blob
     * returned from opensshcert_new_shared, and the trailing
     * private data following the certificate */
    BLOBTRANS_DECLARE(bt);

    BinarySource pubsrc[1];
    BinarySource_BARE_INIT_PL(pubsrc, ptrlen_from_strbuf(basepub));
    get_string(pubsrc);            /* skip key type id */

    /* blobtrans_read might fail in this case, because we're reading
     * from two sources and they might fail to match */
    bool success = blobtrans_read(bt, pubsrc, extra->pub_fmt) &&
        blobtrans_read(bt, src, extra->cert_ossh_fmt);

    blobtrans_write(bt, BinarySink_UPCAST(baseossh), extra->base_ossh_fmt);
    blobtrans_clear(bt);

    if (!success) {
        ssh_key_free(&ck->sshk);
        strbuf_free(basepub);
        strbuf_free(baseossh);
        return NULL;
    }

    strbuf_free(basepub);

    BinarySource osshsrc[1];
    BinarySource_BARE_INIT_PL(osshsrc, ptrlen_from_strbuf(baseossh));
    ck->basekey = ssh_key_new_priv_openssh(self->base_alg, osshsrc);
    strbuf_free(baseossh);

    if (!ck->basekey) {
        ssh_key_free(&ck->sshk);
        return NULL;
    }

    return &ck->sshk;
}